

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcBeamType::~IfcBeamType(IfcBeamType *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&this[-1].field_0x48 = 0x8b3708;
  *(undefined8 *)&this->field_0x30 = 0x8b3820;
  *(undefined8 *)&this[-1].field_0xd0 = 0x8b3730;
  *(undefined8 *)&this[-1].field_0xe0 = 0x8b3758;
  *(undefined8 *)&this[-1].field_0x138 = 0x8b3780;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBeamType,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x8b37a8;
  *(undefined8 *)&this[-1].field_0x1c8 = 0x8b37d0;
  *(undefined8 *)this = 0x8b37f8;
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10);
  }
  *(undefined8 *)&this[-1].field_0x48 = 0x8b3ae8;
  *(undefined8 *)&this->field_0x30 = 0x8b3bb0;
  *(undefined8 *)&this[-1].field_0xd0 = 0x8b3b10;
  *(undefined8 *)&this[-1].field_0xe0 = 0x8b3b38;
  *(undefined8 *)&this[-1].field_0x138 = 0x8b3b60;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBeamType,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x8b3b88;
  puVar1 = *(undefined1 **)
            &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBeamType,_1UL>.field_0x10;
  if (puVar1 != &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBeamType,_1UL>.field_0x20)
  {
    operator_delete(puVar1);
  }
  IfcTypeProduct::~IfcTypeProduct
            ((IfcTypeProduct *)&this[-1].field_0x48,&PTR_construction_vtable_24__008b3848);
  return;
}

Assistant:

IfcBeamType() : Object("IfcBeamType") {}